

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int tconcat(lua_State *L)

{
  lua_Integer lVar1;
  char *s;
  lua_Integer i;
  size_t lsep;
  luaL_Buffer b;
  size_t local_2050;
  luaL_Buffer local_2048;
  
  checktab(L,1,5);
  lVar1 = luaL_len(L,1);
  s = luaL_optlstring(L,2,"",&local_2050);
  i = luaL_optinteger(L,3,1);
  lVar1 = luaL_optinteger(L,4,lVar1);
  luaL_buffinit(L,&local_2048);
  if (i < lVar1) {
    do {
      addfield(L,&local_2048,i);
      luaL_addlstring(&local_2048,s,local_2050);
      i = i + 1;
    } while (lVar1 != i);
  }
  else if (i != lVar1) goto LAB_0013ffa3;
  addfield(L,&local_2048,lVar1);
LAB_0013ffa3:
  luaL_pushresult(&local_2048);
  return 1;
}

Assistant:

static int tconcat (lua_State *L) {
  luaL_Buffer b;
  lua_Integer last = aux_getn(L, 1, TAB_R);
  size_t lsep;
  const char *sep = luaL_optlstring(L, 2, "", &lsep);
  lua_Integer i = luaL_optinteger(L, 3, 1);
  last = luaL_optinteger(L, 4, last);
  luaL_buffinit(L, &b);
  for (; i < last; i++) {
    addfield(L, &b, i);
    luaL_addlstring(&b, sep, lsep);
  }
  if (i == last)  /* add last value (if interval was not empty) */
    addfield(L, &b, i);
  luaL_pushresult(&b);
  return 1;
}